

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

string * __thiscall
duckdb::Bit::ToBit_abi_cxx11_(string *__return_storage_ptr__,Bit *this,string_t str)

{
  bool bVar1;
  char (*__src) [4];
  ConversionException *this_00;
  anon_union_16_2_67f50693_for_value *output_str_00;
  string *in_R8;
  char *__dest;
  string_t str_00;
  string_t str_01;
  bitstring_t output_str;
  anon_union_16_2_67f50693_for_value local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ulong local_38;
  
  output_str_00 = &local_58;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_48._M_local_buf[0] = '\0';
  str_00.value.pointer.ptr = (char *)&local_38;
  str_00.value._0_8_ = str.value._0_8_;
  local_58._0_8_ = &local_48;
  bVar1 = TryGetBitStringSize(this,str_00,(idx_t *)&local_58,in_R8);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_);
    }
    __src = (char (*) [4])operator_new__(local_38);
    __dest = local_58.pointer.prefix;
    local_58.pointer.length = (uint32_t)local_38;
    if (local_58.pointer.length < 0xd) {
      local_58._12_4_ = 0;
      local_58.pointer.prefix[0] = '\0';
      local_58.pointer.prefix[1] = '\0';
      local_58.pointer.prefix[2] = '\0';
      local_58.pointer.prefix[3] = '\0';
      local_58._8_4_ = 0;
      if (local_58.pointer.length != 0) {
        switchD_012dd528::default(__dest,__src,(ulong)(local_58.pointer.length & 0xf));
      }
    }
    else {
      local_58.pointer.prefix = *__src;
      local_58._8_4_ = SUB84(__src,0);
      local_58._12_4_ = (undefined4)((ulong)__src >> 0x20);
    }
    str_01.value.pointer.ptr = (char *)&local_58;
    str_01.value._0_8_ = str.value._0_8_;
    ToBit(this,str_01,(bitstring_t *)&output_str_00->pointer);
    if (0xc < (ulong)local_58.pointer.length) {
      __dest = (char *)CONCAT44(local_58._12_4_,local_58._8_4_);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__dest,__dest + local_58.pointer.length);
    operator_delete__(__src);
    return __return_storage_ptr__;
  }
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  ConversionException::ConversionException(this_00,(string *)&local_58.pointer);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string Bit::ToBit(string_t str) {
	auto bit_len = GetBitSize(str);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::ToBit(str, output_str);
	return output_str.GetString();
}